

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_SetFlagValueTest_IllegalValues::Run(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined8 extraout_RAX;
  char *value;
  FlagSaver fs;
  string local_60;
  FlagSaver local_40;
  string local_38;
  
  FlagSaver::FlagSaver(&local_40);
  value = "IllegalValues";
  fprintf(_stderr,"Running test %s/%s\n","SetFlagValueTest");
  fLB::FLAGS_test_bool = '\x01';
  fLI::FLAGS_test_int32 = 0x77;
  fLI64::FLAGS_test_int64 = 0x4a7;
  fLU::FLAGS_test_uint32 = 0x2e87;
  fLU64::FLAGS_test_uint64 = 0x1d147;
  SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x15034a,"12",value);
  _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run
            ((Test_SetFlagValueTest_IllegalValues *)&local_38);
  SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x14f95e,"-1970",value);
  iVar2 = std::__cxx11::string::compare((char *)&local_60);
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (iVar2 == 0) {
    SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x150845,"7000000000000",value);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar2 != 0) goto LAB_001367a9;
    SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x14f977,"-1",value);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar2 != 0) goto LAB_001367ae;
    SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x14f947,"not a number!",value);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar2 != 0) goto LAB_001367b3;
    SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x15034a,"",value);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar2 != 0) goto LAB_001367b8;
    SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x150845,"",value);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar2 != 0) goto LAB_001367bd;
    SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x14f947,"",value);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar2 != 0) goto LAB_001367c2;
    SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x14f95e,"",value);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar2 != 0) goto LAB_001367c7;
    SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x14f977,"",value);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar2 != 0) goto LAB_001367cc;
    SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x14f010,"",value);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar2 != 0) goto LAB_001367d1;
    SetCommandLineOption_abi_cxx11_(&local_60,(gflags *)0x14efb9,"",value);
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (iVar2 != 0) goto LAB_001367d6;
    if (fLB::FLAGS_test_bool == '\0') goto LAB_001367db;
    if (fLI::FLAGS_test_int32 != 0x77) goto LAB_001367e0;
    if (fLI64::FLAGS_test_int64 != 0x4a7) goto LAB_001367e5;
    if (fLU::FLAGS_test_uint32 == 0x2e87) {
      if (fLU64::FLAGS_test_uint64 == 0x1d147) {
        FlagSaver::~FlagSaver(&local_40);
        return;
      }
      goto LAB_001367ef;
    }
  }
  else {
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367a9:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367ae:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367b3:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367b8:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367bd:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367c2:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367c7:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367cc:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367d1:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367d6:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367db:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367e0:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367e5:
    _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
  }
  _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
LAB_001367ef:
  _GLOBAL__N_1::Test_SetFlagValueTest_IllegalValues::Run();
  FlagSaver::~FlagSaver(&local_40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(SetFlagValueTest, IllegalValues) {
  FLAGS_test_bool = true;
  FLAGS_test_int32 = 119;
  FLAGS_test_int64 = 1191;
  FLAGS_test_uint32 = 11911;
  FLAGS_test_uint64 = 119111;

  EXPECT_EQ("",
            SetCommandLineOption("test_bool", "12"));

  EXPECT_EQ("",
            SetCommandLineOption("test_uint32", "-1970"));

  EXPECT_EQ("",
            SetCommandLineOption("test_int32", "7000000000000"));

  EXPECT_EQ("",
            SetCommandLineOption("test_uint64", "-1"));

  EXPECT_EQ("",
            SetCommandLineOption("test_int64", "not a number!"));

  // Test the empty string with each type of input
  EXPECT_EQ("", SetCommandLineOption("test_bool", ""));
  EXPECT_EQ("", SetCommandLineOption("test_int32", ""));
  EXPECT_EQ("", SetCommandLineOption("test_int64", ""));
  EXPECT_EQ("", SetCommandLineOption("test_uint32", ""));
  EXPECT_EQ("", SetCommandLineOption("test_uint64", ""));
  EXPECT_EQ("", SetCommandLineOption("test_double", ""));
  EXPECT_EQ("test_string set to \n", SetCommandLineOption("test_string", ""));

  EXPECT_TRUE(FLAGS_test_bool);
  EXPECT_EQ(119, FLAGS_test_int32);
  EXPECT_EQ(1191, FLAGS_test_int64);
  EXPECT_EQ(11911, FLAGS_test_uint32);
  EXPECT_EQ(119111, FLAGS_test_uint64);
}